

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall
TApp_SetWithDefaultsConversion_Test::TestBody(TApp_SetWithDefaultsConversion_Test *this)

{
  bool bVar1;
  long lVar2;
  initializer_list<int> __l;
  less<int> local_db;
  allocator local_da;
  allocator_type local_d9;
  AssertHelper local_d8;
  int someint;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined8 uStack_c0;
  string local_a8 [32];
  undefined1 local_88 [8];
  string local_80;
  string local_60;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_40;
  
  someint = 2;
  std::__cxx11::string::string((string *)&local_60,"-a",(allocator *)&local_d8);
  local_c8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000001;
  uStack_c0 = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_c8;
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_40,__l,&local_db,&local_d9);
  std::__cxx11::string::string((string *)&local_80,"",&local_da);
  CLI::App::add_set<int>
            (&(this->super_TApp).app,&local_60,&someint,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_40,&local_80,true);
  std::__cxx11::string::~string((string *)&local_80);
  CLI::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_c8,"-a",(allocator *)&local_d8);
  std::__cxx11::string::string(local_a8,"hi",(allocator *)&local_db);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_c8,local_88);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c8.ptr_ + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x514,
             "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_c8);
  return;
}

Assistant:

TEST_F(TApp, SetWithDefaultsConversion) {
    int someint = 2;
    app.add_set("-a", someint, {1, 2, 3, 4}, "", true);

    args = {"-a", "hi"};

    EXPECT_THROW(run(), CLI::ConversionError);
}